

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNode(Impl *this,Reader node)

{
  word *pwVar1;
  size_t amount;
  size_t sVar2;
  ArrayPtr<capnp::word> uncheckedBuffer;
  MessageSizeCounts MVar3;
  ArrayPtr<capnp::word> AVar4;
  
  MVar3 = capnp::_::StructReader::totalSize(&node._reader);
  amount = MVar3.wordCount * 8 + 8;
  pwVar1 = (word *)(MVar3.wordCount + 1);
  sVar2 = 0;
  AVar4.ptr = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  memset(AVar4.ptr,0,amount);
  uncheckedBuffer.size_ = sVar2;
  uncheckedBuffer.ptr = pwVar1;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&node._reader,AVar4.ptr,uncheckedBuffer);
  AVar4.size_ = (size_t)pwVar1;
  return AVar4;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNode(schema::Node::Reader node) {
  size_t size = node.totalSize().wordCount + 1;
  kj::ArrayPtr<word> result = arena.allocateArray<word>(size);
  memset(result.begin(), 0, size * sizeof(word));
  copyToUnchecked(node, result);
  return result;
}